

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

unsigned_long_long ZSTD_getFrameContentSize(void *src,size_t srcSize)

{
  size_t sVar1;
  undefined1 local_50 [8];
  ZSTD_frameHeader zfh;
  size_t srcSize_local;
  void *src_local;
  
  zfh._40_8_ = srcSize;
  sVar1 = ZSTD_getFrameHeader((ZSTD_frameHeader *)local_50,src,srcSize);
  if (sVar1 == 0) {
    if (zfh.windowSize._4_4_ == 1) {
      src_local = (void *)0x0;
    }
    else {
      src_local = (void *)local_50;
    }
  }
  else {
    src_local = (void *)0xfffffffffffffffe;
  }
  return (unsigned_long_long)src_local;
}

Assistant:

unsigned long long ZSTD_getFrameContentSize(const void *src, size_t srcSize)
{
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize)) {
        unsigned long long const ret = ZSTD_getDecompressedSize_legacy(src, srcSize);
        return ret == 0 ? ZSTD_CONTENTSIZE_UNKNOWN : ret;
    }
#endif
    {   ZSTD_frameHeader zfh;
        if (ZSTD_getFrameHeader(&zfh, src, srcSize) != 0)
            return ZSTD_CONTENTSIZE_ERROR;
        if (zfh.frameType == ZSTD_skippableFrame) {
            return 0;
        } else {
            return zfh.frameContentSize;
    }   }
}